

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteBytes
               (int field_number,string *value,CodedOutputStream *output)

{
  pointer data;
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  byte *pbVar4;
  
  pbVar4 = output->cur_;
  if ((output->impl_).end_ <= pbVar4) {
    pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar4);
  }
  uVar1 = (ulong)(field_number * 8 + 2);
  if (0x7f < (uint)(field_number << 3)) {
    do {
      uVar3 = (uint)uVar1;
      *pbVar4 = (byte)uVar1 | 0x80;
      uVar1 = uVar1 >> 7;
      pbVar4 = pbVar4 + 1;
    } while (0x3fff < uVar3);
  }
  *pbVar4 = (byte)uVar1;
  pbVar4 = pbVar4 + 1;
  output->cur_ = pbVar4;
  uVar1 = value->_M_string_length;
  if (uVar1 < 0x80000000) {
    if (pbVar4 < (output->impl_).end_) goto LAB_00314ab7;
  }
  else {
    WriteBytes();
  }
  pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar4);
LAB_00314ab7:
  if (uVar1 < 0x80) {
    uVar2 = uVar1 & 0xffffffff;
  }
  else {
    uVar2 = uVar1 & 0xffffffff;
    do {
      uVar3 = (uint)uVar1;
      *pbVar4 = (byte)uVar1 | 0x80;
      uVar2 = uVar2 >> 7;
      pbVar4 = pbVar4 + 1;
      uVar1 = uVar2;
    } while (0x3fff < uVar3);
  }
  *pbVar4 = (byte)uVar2;
  pbVar4 = pbVar4 + 1;
  output->cur_ = pbVar4;
  data = (value->_M_dataplus)._M_p;
  uVar3 = (uint)value->_M_string_length;
  if ((long)(output->impl_).end_ - (long)pbVar4 < (long)(int)uVar3) {
    pbVar4 = io::EpsCopyOutputStream::WriteRawFallback(&output->impl_,data,uVar3,pbVar4);
  }
  else {
    memcpy(pbVar4,data,(ulong)uVar3);
    pbVar4 = pbVar4 + (int)uVar3;
  }
  output->cur_ = pbVar4;
  return;
}

Assistant:

void WireFormatLite::WriteBytes(int field_number, const std::string& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  ABSL_CHECK_LE(value.size(), kInt32MaxSize);
  output->WriteVarint32(value.size());
  output->WriteString(value);
}